

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

monst * newmonst(int extyp,int namelen)

{
  monst *pmVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (extyp - 1U < 5) {
    uVar2 = *(uint *)(&DAT_0029c6e4 + (ulong)(extyp - 1U) * 4);
  }
  pmVar1 = (monst *)calloc(1,(long)namelen + (ulong)uVar2 + 0x78);
  pmVar1->mxtyp = (uchar)extyp;
  pmVar1->mxlth = (short)uVar2;
  pmVar1->mnamelth = (uchar)namelen;
  return pmVar1;
}

Assistant:

struct monst *newmonst(int extyp, int namelen)
{
	struct monst *mon;
	int xlen;
	
	switch (extyp) {
	    case MX_EMIN: xlen = sizeof(struct emin); break;
	    case MX_EPRI: xlen = sizeof(struct epri); break;
	    case MX_EGD:  xlen = sizeof(struct egd);  break;
	    case MX_ESHK: xlen = sizeof(struct eshk); break;
	    case MX_EDOG: xlen = sizeof(struct edog); break;
	    default:      xlen = 0; break;
	}
	
	mon = malloc(sizeof(struct monst) + namelen + xlen);
	memset(mon, 0, sizeof(struct monst) + namelen + xlen);
	mon->mxtyp = extyp;
	mon->mxlth = xlen;
	mon->mnamelth = namelen;
	
	return mon;
}